

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtptcptransmitter.cpp
# Opt level: O0

int __thiscall
jrtplib::RTPTCPTransmitter::GetLocalHostName
          (RTPTCPTransmitter *this,uint8_t *buffer,size_t *bufferlength)

{
  ulong uVar1;
  size_type sVar2;
  reference pvVar3;
  size_t *bufferlength_local;
  uint8_t *buffer_local;
  RTPTCPTransmitter *this_local;
  
  if ((this->m_init & 1U) == 0) {
    this_local._4_4_ = -0xb5;
  }
  else if ((this->m_created & 1U) == 0) {
    this_local._4_4_ = -0xbb;
  }
  else {
    sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->m_localHostname)
    ;
    if (sVar2 == 0) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this->m_localHostname,9);
      pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&this->m_localHostname,0);
      sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        (&this->m_localHostname);
      memcpy(pvVar3,"localhost",sVar2);
    }
    uVar1 = *bufferlength;
    sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->m_localHostname)
    ;
    if (uVar1 < sVar2) {
      sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        (&this->m_localHostname);
      *bufferlength = sVar2;
      this_local._4_4_ = -0x45;
    }
    else {
      pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&this->m_localHostname,0);
      sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        (&this->m_localHostname);
      memcpy(buffer,pvVar3,sVar2);
      sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        (&this->m_localHostname);
      *bufferlength = sVar2;
      this_local._4_4_ = 0;
    }
  }
  return this_local._4_4_;
}

Assistant:

int RTPTCPTransmitter::GetLocalHostName(uint8_t *buffer,size_t *bufferlength)
{
	if (!m_init)
		return ERR_RTP_TCPTRANS_NOTINIT;

	MAINMUTEX_LOCK
	if (!m_created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_TCPTRANS_NOTCREATED;
	}

	if (m_localHostname.size() == 0)
	{
		//
		// TODO
		// TODO
		// TODO
		// TODO
		//
		m_localHostname.resize(9);
		memcpy(&m_localHostname[0], "localhost", m_localHostname.size());
	}
	
	if ((*bufferlength) < m_localHostname.size())
	{
		*bufferlength = m_localHostname.size(); // tell the application the required size of the buffer
		MAINMUTEX_UNLOCK
		return ERR_RTP_TRANS_BUFFERLENGTHTOOSMALL;
	}

	memcpy(buffer,&m_localHostname[0], m_localHostname.size());
	*bufferlength = m_localHostname.size();
	
	MAINMUTEX_UNLOCK
	return 0;
}